

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbString.cpp
# Opt level: O2

void __thiscall Hpipe::CbString::CbString(CbString *this,CbStringPtr *bs,PT b_off,PT b_len)

{
  Buffer *pBVar1;
  bool bVar2;
  ulong ed;
  ulong uVar3;
  Buffer *b;
  ulong uVar4;
  anon_class_24_3_09656f79 local_48;
  PT local_30;
  
  this->end = 0;
  this->beg = (Buffer *)0x0;
  this->off = 0;
  if (b_len != 0) {
    local_48.b_off = &local_30;
    uVar3 = bs->off;
    ed = bs->end;
    if (uVar3 < ed) {
      b = bs->beg;
      uVar4 = b->used;
      local_48.this = this;
      local_48.b_len = b_len;
      local_30 = b_off;
      if (ed < uVar4 || ed - uVar4 == 0) {
LAB_00142359:
        CbString::anon_class_24_3_09656f79::operator()(&local_48,b,uVar3,ed);
      }
      else {
        pBVar1 = b->next;
        bVar2 = CbString::anon_class_24_3_09656f79::operator()(&local_48,b,uVar3,uVar4);
        ed = ed - uVar4;
        b = pBVar1;
        if (pBVar1 != (Buffer *)0x0 && bVar2) {
          do {
            uVar3 = b->used;
            uVar4 = ed - uVar3;
            if (ed < uVar3 || uVar4 == 0) {
              uVar3 = 0;
              goto LAB_00142359;
            }
            pBVar1 = b->next;
            bVar2 = CbString::anon_class_24_3_09656f79::operator()(&local_48,b,0,uVar3);
            if (!bVar2) {
              return;
            }
            uVar3 = pBVar1->used;
            if (uVar4 < uVar3 || uVar4 - uVar3 == 0) {
              uVar3 = 0;
              ed = uVar4;
              b = pBVar1;
              goto LAB_00142359;
            }
            b = pBVar1->next;
            bVar2 = CbString::anon_class_24_3_09656f79::operator()(&local_48,pBVar1,0,uVar3);
            ed = uVar4 - uVar3;
          } while (bVar2);
        }
      }
    }
  }
  return;
}

Assistant:

CbString::CbString( const CbStringPtr &bs, PT b_off, PT b_len ) : beg( 0 ), off( 0 ), end( 0 ) {
    if ( not b_len )
        return;
    bs.visitor( [ this, &b_off, b_len ]( const Buffer *b, PT bd, PT ed ) {
        PT sd = ed - bd;
        // we have to take this buffer ?
        if ( b_off < sd ) {
            Buffer::inc_ref( b );

            // first buffer in this ?
            if ( not beg ) {
                beg = b;
                off = bd + b_off;
                end = off + b_len;
            }

            // that was the last buffer ?
            if ( b_off + b_len <= sd )
                return false;
            b_off = 0;
        } else
            b_off -= sd;
        return true;
    } );
}